

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportInstallFileGenerator::GenerateImportFileConfig
          (cmExportInstallFileGenerator *this,string *config)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  bool bVar4;
  string fileName;
  string local_438;
  string se;
  cmGeneratedFileStream exportFileStream;
  ostringstream e;
  
  bVar1 = cmInstallGenerator::InstallsForConfig(&this->IEGen->super_cmInstallGenerator,config);
  bVar4 = true;
  if (bVar1) {
    exportFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream._0_1_ = 0x2f;
    e = (ostringstream)0x2d;
    cmStrCat<std::__cxx11::string&,char,std::__cxx11::string&,char>
              (&fileName,&(this->super_cmExportFileGenerator).FileDir,(char *)&exportFileStream,
               &(this->super_cmExportFileGenerator).FileBase,(char *)&e);
    if (config->_M_string_length == 0) {
      std::__cxx11::string::append((char *)&fileName);
    }
    else {
      cmsys::SystemTools::LowerCase((string *)&exportFileStream,config);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&exportFileStream);
    }
    std::__cxx11::string::append((string *)&fileName);
    cmGeneratedFileStream::cmGeneratedFileStream(&exportFileStream,&fileName,true,None);
    bVar4 = ((&exportFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               field_0x20)
             [*(long *)(CONCAT71(exportFileStream.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._1_7_,
                                 exportFileStream.super_ofstream.
                                 super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream._0_1_) + -0x18)] & 5) == 0;
    if (bVar4) {
      cmGeneratedFileStream::SetCopyIfDifferent(&exportFileStream,true);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[4])
                (this,&exportFileStream,config);
      cmExportFileGenerator::GenerateImportConfig
                (&this->super_cmExportFileGenerator,(ostream *)&exportFileStream,config);
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[5])(this,&exportFileStream);
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->ConfigImportFiles,config);
      std::__cxx11::string::_M_assign((string *)pmVar3);
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar2 = std::operator<<((ostream *)&e,"cannot write to file \"");
      poVar2 = std::operator<<(poVar2,(string *)&fileName);
      poVar2 = std::operator<<(poVar2,"\": ");
      std::operator<<(poVar2,(string *)&se);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_438);
      std::__cxx11::string::~string((string *)&local_438);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      std::__cxx11::string::~string((string *)&se);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&exportFileStream);
    std::__cxx11::string::~string((string *)&fileName);
  }
  return bVar4;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateImportFileConfig(
  const std::string& config)
{
  // Skip configurations not enabled for this export.
  if (!this->IEGen->InstallsForConfig(config)) {
    return true;
  }

  // Construct the name of the file to generate.
  std::string fileName = cmStrCat(this->FileDir, '/', this->FileBase, '-');
  if (!config.empty()) {
    fileName += cmSystemTools::LowerCase(config);
  } else {
    fileName += "noconfig";
  }
  fileName += this->FileExt;

  // Open the output file to generate it.
  cmGeneratedFileStream exportFileStream(fileName, true);
  if (!exportFileStream) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  exportFileStream.SetCopyIfDifferent(true);
  std::ostream& os = exportFileStream;

  // Start with the import file header.
  this->GenerateImportHeaderCode(os, config);

  // Generate the per-config target information.
  this->GenerateImportConfig(os, config);

  // End with the import file footer.
  this->GenerateImportFooterCode(os);

  // Record this per-config import file.
  this->ConfigImportFiles[config] = fileName;

  return true;
}